

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rco.cpp
# Opt level: O1

string * RCO::fileExtensionFromType(string *__return_storage_ptr__,string *type)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  
  iVar1 = std::__cxx11::string::compare((char *)type);
  if (iVar1 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "jpg";
    pcVar2 = "";
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)type);
    if (iVar1 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "tif";
      pcVar2 = "";
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)type);
      if (iVar1 == 0) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = "gif";
        pcVar2 = "";
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)type);
        if (iVar1 == 0) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar3 = "gxt";
          pcVar2 = "";
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)type);
          if (iVar1 == 0) {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            pcVar3 = "gim";
            pcVar2 = "";
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)type);
            if (iVar1 != 0) {
              iVar1 = std::__cxx11::string::compare((char *)type);
              if (iVar1 != 0) {
                iVar1 = std::__cxx11::string::compare((char *)type);
                if (iVar1 == 0) {
                  (__return_storage_ptr__->_M_dataplus)._M_p =
                       (pointer)&__return_storage_ptr__->field_2;
                  pcVar3 = "dds";
                  pcVar2 = "";
                }
                else {
                  iVar1 = std::__cxx11::string::compare((char *)type);
                  if (iVar1 == 0) {
                    (__return_storage_ptr__->_M_dataplus)._M_p =
                         (pointer)&__return_storage_ptr__->field_2;
                    pcVar3 = "vag";
                    pcVar2 = "";
                  }
                  else {
                    iVar1 = std::__cxx11::string::compare((char *)type);
                    if (iVar1 == 0) {
                      (__return_storage_ptr__->_M_dataplus)._M_p =
                           (pointer)&__return_storage_ptr__->field_2;
                      pcVar3 = "wav";
                      pcVar2 = "";
                    }
                    else {
                      iVar1 = std::__cxx11::string::compare((char *)type);
                      if (iVar1 == 0) {
                        (__return_storage_ptr__->_M_dataplus)._M_p =
                             (pointer)&__return_storage_ptr__->field_2;
                        pcVar3 = "mp3";
                        pcVar2 = "";
                      }
                      else {
                        iVar1 = std::__cxx11::string::compare((char *)type);
                        if (iVar1 == 0) {
                          (__return_storage_ptr__->_M_dataplus)._M_p =
                               (pointer)&__return_storage_ptr__->field_2;
                          pcVar3 = "at3";
                          pcVar2 = "";
                        }
                        else {
                          iVar1 = std::__cxx11::string::compare((char *)type);
                          (__return_storage_ptr__->_M_dataplus)._M_p =
                               (pointer)&__return_storage_ptr__->field_2;
                          if (iVar1 == 0) {
                            pcVar3 = "aac";
                            pcVar2 = "";
                          }
                          else {
                            pcVar3 = "bin";
                            pcVar2 = "";
                          }
                        }
                      }
                    }
                  }
                }
                goto LAB_001041fb;
              }
            }
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            pcVar3 = "png";
            pcVar2 = "";
          }
        }
      }
    }
  }
LAB_001041fb:
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string RCO::fileExtensionFromType(std::string type)
{
	if (type == "texture/jpg")
		return "jpg";
	if (type == "texture/tif")
		return "tif";
	if (type == "texture/gif")
		return "gif";
	if (type == "texture/gxt")
		return "gxt";
	if (type == "texture/gim")
		return "gim";
	if (type == "texture/png")
		return "png";
	// Some PS4 RCOs have just png and not texture/png
	if (type == "png")
		return "png";
	if (type == "texture/dds")
		return "dds";
	if (type == "sound/vag")
		return "vag";
	if (type == "sound/wav")
		return "wav";
	if (type == "sound/mp3")
		return "mp3";
	if (type == "sound/at3")
		return "at3";
	if (type == "sound/aac")
		return "aac";
	return "bin";
}